

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

SequenceRange __thiscall
slang::ast::SequenceRepetition::applyTo(SequenceRepetition *this,SequenceRange res)

{
  ulong uVar1;
  long lVar2;
  undefined4 uVar3;
  uint uVar4;
  ulong uVar5;
  SequenceRange SVar6;
  _Storage<unsigned_int,_true> _Stack_c;
  undefined1 local_8;
  
  _Stack_c._M_value =
       res.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload;
  local_8 = res.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged;
  uVar1 = (res._0_8_ & 0xffffffff) * (ulong)(this->range).min;
  uVar5 = 0xffffffff;
  if ((int)(uVar1 >> 0x20) == 0) {
    uVar5 = uVar1 & 0xffffffff;
  }
  uVar3 = (undefined4)uVar5;
  if (((undefined1  [12])res & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
    if ((this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      lVar2 = (ulong)_Stack_c._M_value *
              (ulong)(this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_payload._M_value;
      uVar4 = (uint)((ulong)lVar2 >> 0x20);
      uVar5 = (ulong)uVar4;
      local_8 = uVar4 == 0;
      _Stack_c._M_value = (uint)lVar2;
    }
    else if (((undefined1  [12])res & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
      local_8 = 0;
    }
  }
  SVar6.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value = _Stack_c._M_value;
  SVar6.min = uVar3;
  SVar6.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._4_4_ =
       (undefined4)CONCAT71((int7)(uVar5 >> 8),local_8);
  return SVar6;
}

Assistant:

SequenceRange SequenceRepetition::applyTo(SequenceRange res) const {
    res.min = checkedMulU32(res.min, range.min).value_or(UINT32_MAX);
    if (res.max && range.max)
        res.max = checkedMulU32(*res.max, *range.max);
    else
        res.max.reset();

    return res;
}